

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

void __thiscall
jwt::token_verification_exception::token_verification_exception
          (token_verification_exception *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"token verification failed: ",msg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_00113cf8;
  return;
}

Assistant:

explicit token_verification_exception(const std::string& msg)
			: std::runtime_error("token verification failed: " + msg)
		{}